

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall spirv_cross::Compiler::Compiler(Compiler *this,uint32_t *ir_,size_t word_count)

{
  ParsedIR *ir__00;
  undefined1 local_848 [8];
  Parser parser;
  size_t word_count_local;
  uint32_t *ir__local;
  Compiler *this_local;
  
  this->_vptr_Compiler = (_func_int **)&PTR__Compiler_00856f28;
  parser.forward_pointer_fixups.stack_storage.aligned_char._56_8_ = word_count;
  ParsedIR::ParsedIR(&this->ir);
  SmallVector<unsigned_int,_8UL>::SmallVector(&this->global_variables);
  SmallVector<unsigned_int,_8UL>::SmallVector(&this->aliased_variables);
  this->current_function = (SPIRFunction *)0x0;
  this->current_block = (SPIRBlock *)0x0;
  this->current_loop_level = 0;
  ::std::
  unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
  ::unordered_set(&this->active_interface_variables);
  this->check_active_interface_variables = false;
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->invalid_expressions);
  this->is_force_recompile = false;
  this->is_force_recompile_forward_progress = false;
  SmallVector<spirv_cross::CombinedImageSampler,_8UL>::SmallVector(&this->combined_image_samplers);
  SmallVector<unsigned_int,_8UL>::SmallVector(&this->global_struct_cache);
  ::std::
  function<void_(const_spirv_cross::SPIRType_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->variable_remap_callback);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->forced_temporaries);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->forwarded_temporaries);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->suppressed_usage_tracking);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->hoisted_temporaries);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->forced_invariant_temporaries);
  Bitset::Bitset(&this->active_input_builtins);
  Bitset::Bitset(&this->active_output_builtins);
  this->clip_distance_count = 0;
  this->cull_distance_count = 0;
  this->position_invariant = false;
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->comparison_ids);
  this->need_subpass_input = false;
  this->need_subpass_input_ms = false;
  this->dummy_sampler_id = 0;
  ::std::
  unordered_map<unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>_>_>
  ::unordered_map(&this->function_cfgs);
  SmallVector<unsigned_int,_8UL>::SmallVector(&this->physical_storage_non_block_pointer_types);
  ::std::
  unordered_map<unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>_>_>
  ::unordered_map(&this->physical_storage_type_to_alignment);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->interlocked_resources);
  this->interlocked_is_complex = false;
  ::std::
  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->declared_block_names);
  Parser::Parser((Parser *)local_848,ir_,
                 parser.forward_pointer_fixups.stack_storage.aligned_char._56_8_);
  Parser::parse((Parser *)local_848);
  ir__00 = Parser::get_parsed_ir((Parser *)local_848);
  set_ir(this,ir__00);
  Parser::~Parser((Parser *)local_848);
  return;
}

Assistant:

Compiler::Compiler(const uint32_t *ir_, size_t word_count)
{
	Parser parser(ir_, word_count);
	parser.parse();
	set_ir(std::move(parser.get_parsed_ir()));
}